

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadBodyMesh.cpp
# Opt level: O1

void __thiscall
chrono::ChLoadBodyMesh::ChLoadBodyMesh
          (ChLoadBodyMesh *this,shared_ptr<chrono::ChBody> *cbody,ChTriangleMeshConnected *cmesh)

{
  ChLoadBase::ChLoadBase(&this->super_ChLoadBase);
  (this->super_ChLoadBase).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLoadBodyMesh_00b49ba0;
  (this->contactbody).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->contactbody).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->contactmesh).super_ChTriangleMesh.super_ChGeometry._vptr_ChGeometry =
       (_func_int **)&PTR__ChTriangleMeshConnected_00b669b8;
  (this->contactmesh).m_vertices.
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contactmesh).m_vertices.
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contactmesh).m_vertices.
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->contactmesh).m_normals.
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contactmesh).m_normals.
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contactmesh).m_normals.
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->contactmesh).m_UV.
  super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contactmesh).m_UV.
  super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contactmesh).m_UV.
  super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->contactmesh).m_colors.super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contactmesh).m_colors.super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contactmesh).m_colors.super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->contactmesh).m_face_v_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contactmesh).m_face_v_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contactmesh).m_face_v_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->contactmesh).m_face_n_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contactmesh).m_face_n_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contactmesh).m_face_n_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->contactmesh).m_face_uv_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contactmesh).m_face_uv_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contactmesh).m_face_uv_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->contactmesh).m_face_col_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contactmesh).m_face_col_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contactmesh).m_face_col_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->contactmesh).m_face_uv_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contactmesh).m_face_uv_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->contactmesh).m_face_col_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contactmesh).m_face_col_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contactmesh).m_face_col_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->contactmesh).m_face_mat_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contactmesh).m_face_mat_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contactmesh).m_face_mat_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->contactmesh).m_filename._M_dataplus._M_p = (pointer)&(this->contactmesh).m_filename.field_2
  ;
  (this->contactmesh).m_filename._M_string_length = 0;
  (this->contactmesh).m_filename.field_2._M_local_buf[0] = '\0';
  (this->forces).
  super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->forces).
  super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->forces).
  super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->contactbody).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (cbody->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->contactbody).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(cbody->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::operator=
            (&(this->contactmesh).m_vertices,&cmesh->m_vertices);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::operator=
            (&(this->contactmesh).m_normals,&cmesh->m_normals);
  std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>::operator=
            (&(this->contactmesh).m_UV,&cmesh->m_UV);
  std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>::operator=
            (&(this->contactmesh).m_colors,&cmesh->m_colors);
  std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::operator=
            (&(this->contactmesh).m_face_v_indices,&cmesh->m_face_v_indices);
  std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::operator=
            (&(this->contactmesh).m_face_n_indices,&cmesh->m_face_n_indices);
  std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::operator=
            (&(this->contactmesh).m_face_uv_indices,&cmesh->m_face_uv_indices);
  std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::operator=
            (&(this->contactmesh).m_face_col_indices,&cmesh->m_face_col_indices);
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->contactmesh).m_face_mat_indices,&cmesh->m_face_mat_indices);
  std::__cxx11::string::_M_assign((string *)&(this->contactmesh).m_filename);
  return;
}

Assistant:

ChLoadBodyMesh::ChLoadBodyMesh(std::shared_ptr<ChBody> cbody, geometry::ChTriangleMeshConnected& cmesh) {
    contactbody = cbody;
    contactmesh = cmesh;
}